

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.h
# Opt level: O2

bool __thiscall
BamTools::BamAlignment::GetTag<signed_char>(BamAlignment *this,string *tag,char *destination)

{
  size_type sVar1;
  bool bVar2;
  char *pTagData;
  uint numBytesParsed;
  uint tagDataLength;
  char *local_18;
  uint local_10;
  uint local_c;
  
  if (((this->SupportData).HasCoreOnly != false) ||
     (sVar1 = (this->TagData)._M_string_length, sVar1 == 0)) {
    return false;
  }
  local_18 = (this->TagData)._M_dataplus._M_p;
  local_c = (uint)sVar1;
  local_10 = 0;
  bVar2 = FindTag(this,tag,&local_18,&local_c,&local_10);
  if ((bVar2) && ((local_18[-1] == 'c' || (local_18[-1] == 'A')))) {
    *destination = '\0';
    *destination = *local_18;
    return true;
  }
  return false;
}

Assistant:

inline bool BamAlignment::GetTag(const std::string& tag, T& destination) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // return failure if tag not found
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // fetch data type
    const char type = *(pTagData - 1);
    if (!TagTypeHelper<T>::CanConvertFrom(type)) {
        // TODO: set error string ?
        return false;
    }

    // determine data length
    int destinationLength = 0;
    switch (type) {

        // 1 byte data
        case (Constants::BAM_TAG_TYPE_ASCII):
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
            destinationLength = 1;
            break;

        // 2 byte data
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
            destinationLength = 2;
            break;

        // 4 byte data
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
            destinationLength = 4;
            break;

        // var-length types not supported for numeric destination
        case (Constants::BAM_TAG_TYPE_STRING):
        case (Constants::BAM_TAG_TYPE_HEX):
        case (Constants::BAM_TAG_TYPE_ARRAY):
            SetErrorString("BamAlignment::GetTag",
                           "cannot store variable length tag data into a numeric destination");
            return false;

        // unrecognized tag type
        default:
            const std::string message = std::string("invalid tag type: ") + type;
            SetErrorString("BamAlignment::GetTag", message);
            return false;
    }

    // store data in destination
    destination = 0;
    memcpy(&destination, pTagData, destinationLength);

    // return success
    return true;
}